

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_https.hpp
# Opt level: O1

void __thiscall
SimpleWeb::Server<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Server
          (Server<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this,
          string *cert_file,string *private_key_file,string *verify_file)

{
  context *this_00;
  SSL_CTX *ctx;
  int iVar1;
  error_category *peVar2;
  ulong uVar3;
  undefined4 extraout_var;
  uint uVar4;
  error_code __ec;
  system_error asStack_48 [32];
  
  ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::ServerBase
            (&this->super_ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,
             0x1bb);
  (this->super_ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>).
  _vptr_ServerBase = (_func_int **)&PTR__Server_001a90b0;
  this->set_session_id_context = false;
  this_00 = &this->context;
  asio::ssl::context::context(this_00,tlsv12);
  asio::ssl::context::use_certificate_chain_file(this_00,cert_file);
  ERR_clear_error();
  iVar1 = SSL_CTX_use_PrivateKey_file
                    ((SSL_CTX *)this_00->handle_,(private_key_file->_M_dataplus)._M_p,1);
  if (iVar1 == 1) {
    uVar4 = 0;
    peVar2 = (error_category *)std::_V2::system_category();
  }
  else {
    uVar3 = ERR_get_error();
    uVar4 = (uint)uVar3;
    peVar2 = (error_category *)&asio::error::get_ssl_category()::instance;
    if (asio::error::get_ssl_category()::instance == '\0') {
      iVar1 = __cxa_guard_acquire(&asio::error::get_ssl_category()::instance);
      if (iVar1 != 0) {
        peVar2 = (error_category *)&asio::error::get_ssl_category()::instance;
        __cxa_atexit(std::_V2::error_category::~error_category,
                     &asio::error::get_ssl_category()::instance,&__dso_handle);
        __cxa_guard_release(&asio::error::get_ssl_category()::instance);
      }
    }
  }
  if (uVar4 == 0) {
    if (verify_file->_M_string_length != 0) {
      asio::ssl::context::load_verify_file(this_00,verify_file);
      ctx = (SSL_CTX *)this_00->handle_;
      iVar1 = SSL_CTX_get_verify_callback((int)ctx,(X509_STORE_CTX *)verify_file);
      SSL_CTX_set_verify(ctx,7,(callback *)CONCAT44(extraout_var,iVar1));
      this->set_session_id_context = true;
    }
    return;
  }
  __ec._4_4_ = 0;
  __ec._M_value = uVar4;
  __ec._M_cat = peVar2;
  std::system_error::system_error(asStack_48,__ec,"use_private_key_file");
  boost::throw_exception<std::system_error>(asStack_48);
}

Assistant:

Server(const std::string &cert_file, const std::string &private_key_file, const std::string &verify_file = std::string())
        : ServerBase<HTTPS>::ServerBase(443), context(asio::ssl::context::tlsv12) {
      context.use_certificate_chain_file(cert_file);
      context.use_private_key_file(private_key_file, asio::ssl::context::pem);

      if(verify_file.size() > 0) {
        context.load_verify_file(verify_file);
        context.set_verify_mode(asio::ssl::verify_peer | asio::ssl::verify_fail_if_no_peer_cert | asio::ssl::verify_client_once);
        set_session_id_context = true;
      }
    }